

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

ParsedIR * __thiscall diligent_spirv_cross::ParsedIR::operator=(ParsedIR *this,ParsedIR *other)

{
  SmallVector<diligent_spirv_cross::Variant,_8UL> *this_00;
  uint32_t uVar1;
  MemoryModel MVar2;
  uint32_t uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  _Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false> local_38;
  
  if (this != other) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->spirv,&other->spirv);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->meta)._M_h,&(other->meta)._M_h);
    for (lVar5 = 0x130; lVar5 != 0x440; lVar5 = lVar5 + 0x38) {
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
                ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
                 ((this->ids).stack_storage.aligned_char + lVar5 + -0x38),
                 (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
                 ((other->ids).stack_storage.aligned_char + lVar5 + -0x38));
    }
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_undef_or_type,&other->ids_for_constant_undef_or_type);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_or_variable,&other->ids_for_constant_or_variable);
    SmallVector<spv::Capability,_8UL>::operator=
              (&this->declared_capabilities,&other->declared_capabilities);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::operator=(&this->declared_extensions,&other->declared_extensions);
    SmallVector<unsigned_char,_8UL>::operator=(&this->block_meta,&other->block_meta);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->continue_block_to_loop_header)._M_h,
                &(other->continue_block_to_loop_header)._M_h);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->entry_points)._M_h,&(other->entry_points)._M_h);
    (this->default_entry_point).id = (other->default_entry_point).id;
    uVar1 = (other->source).version;
    *(undefined4 *)((long)&(this->source).version + 3) =
         *(undefined4 *)((long)&(other->source).version + 3);
    (this->source).version = uVar1;
    MVar2 = other->memory_model;
    uVar1 = other->loop_iteration_depth_hard;
    uVar3 = other->loop_iteration_depth_soft;
    this->addressing_model = other->addressing_model;
    this->memory_model = MVar2;
    this->loop_iteration_depth_hard = uVar1;
    this->loop_iteration_depth_soft = uVar3;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=(&(this->meta_needing_name_fixup)._M_h,&(other->meta_needing_name_fixup)._M_h);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_unsigned_int>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->load_type_width)._M_h,&(other->load_type_width)._M_h);
    this_00 = &this->ids;
    SmallVector<diligent_spirv_cross::Variant,_8UL>::clear(this_00);
    SmallVector<diligent_spirv_cross::Variant,_8UL>::reserve
              (this_00,(other->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size);
    lVar5 = 0;
    for (uVar4 = 0; uVar4 < (other->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size
        ; uVar4 = uVar4 + 1) {
      local_38._M_head_impl =
           (this->pool_group)._M_t.
           super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
      SmallVector<diligent_spirv_cross::Variant,8ul>::
      emplace_back<diligent_spirv_cross::ObjectPoolGroup*>
                ((SmallVector<diligent_spirv_cross::Variant,8ul> *)this_00,&local_38._M_head_impl);
      Variant::operator=((this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr +
                         ((this->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size -
                         1),(Variant *)
                            ((long)&((other->ids).super_VectorView<diligent_spirv_cross::Variant>.
                                    ptr)->group + lVar5));
      lVar5 = lVar5 + 0x18;
    }
  }
  return this;
}

Assistant:

ParsedIR &ParsedIR::operator=(const ParsedIR &other)
{
	if (this != &other)
	{
		spirv = other.spirv;
		meta = other.meta;
		for (int i = 0; i < TypeCount; i++)
			ids_for_type[i] = other.ids_for_type[i];
		ids_for_constant_undef_or_type = other.ids_for_constant_undef_or_type;
		ids_for_constant_or_variable = other.ids_for_constant_or_variable;
		declared_capabilities = other.declared_capabilities;
		declared_extensions = other.declared_extensions;
		block_meta = other.block_meta;
		continue_block_to_loop_header = other.continue_block_to_loop_header;
		entry_points = other.entry_points;
		default_entry_point = other.default_entry_point;
		source = other.source;
		loop_iteration_depth_hard = other.loop_iteration_depth_hard;
		loop_iteration_depth_soft = other.loop_iteration_depth_soft;
		addressing_model = other.addressing_model;
		memory_model = other.memory_model;


		meta_needing_name_fixup = other.meta_needing_name_fixup;
		load_type_width = other.load_type_width;

		// Very deliberate copying of IDs. There is no default copy constructor, nor a simple default constructor.
		// Construct object first so we have the correct allocator set-up, then we can copy object into our new pool group.
		ids.clear();
		ids.reserve(other.ids.size());
		for (size_t i = 0; i < other.ids.size(); i++)
		{
			ids.emplace_back(pool_group.get());
			ids.back() = other.ids[i];
		}
	}
	return *this;
}